

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

void __thiscall ftxui::anon_unknown_0::BgColor::Render(BgColor *this,Screen *screen)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  Pixel *pPVar6;
  int iVar7;
  int x;
  int y;
  
  y = (this->super_NodeDecorator).super_Node.box_.y_min;
  iVar7 = (this->super_NodeDecorator).super_Node.box_.y_max;
  if (y <= iVar7) {
    iVar5 = (this->super_NodeDecorator).super_Node.box_.x_max;
    do {
      x = (this->super_NodeDecorator).super_Node.box_.x_min;
      if (x <= iVar5) {
        do {
          pPVar6 = Screen::PixelAt(screen,x,y);
          uVar2 = (this->super_NodeDecorator).super_Node.field_0x5d;
          uVar3 = (this->super_NodeDecorator).super_Node.field_0x5e;
          uVar4 = (this->super_NodeDecorator).super_Node.field_0x5f;
          (pPVar6->background_color).type_ = (this->super_NodeDecorator).super_Node.field_0x5c;
          (pPVar6->background_color).red_ = uVar2;
          (pPVar6->background_color).green_ = uVar3;
          (pPVar6->background_color).blue_ = uVar4;
          iVar5 = (this->super_NodeDecorator).super_Node.box_.x_max;
          bVar1 = x < iVar5;
          x = x + 1;
        } while (bVar1);
        iVar7 = (this->super_NodeDecorator).super_Node.box_.y_max;
      }
      bVar1 = y < iVar7;
      y = y + 1;
    } while (bVar1);
  }
  Node::Render((Node *)this,screen);
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y).background_color = color_;
      }
    }
    NodeDecorator::Render(screen);
  }